

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatTest_FormattedSize_Test::TestBody(FormatTest_FormattedSize_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong in_RSI;
  char *message;
  iterator iVar3;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  args;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [3];
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_40.data_._0_4_ = 2;
  local_38[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000002a;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_> *)
       local_38;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>,int>
                ::TYPES;
  iVar3 = fmt::v5::
          vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                    ((range)(auVar1 << 0x40),format_str,args,(locale_ref)0x0);
  local_38[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3.count_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_20,"2u","fmt::formatted_size(\"{}\", 42)",(uint *)&local_40,
             (unsigned_long *)local_38);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x800,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38[0].ptr_ + 8))();
      }
      local_38[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatTest, FormattedSize) {
  EXPECT_EQ(2u, fmt::formatted_size("{}", 42));
}